

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GreaterEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_greaterequal(NeuralNetworkLayer *this)

{
  ulong uVar1;
  GreaterEqualLayerParams *pGVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x340) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x340;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::GreaterEqualLayerParams>(arena);
    (this->layer_).greaterequal_ = pGVar2;
  }
  return (GreaterEqualLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterEqualLayerParams* NeuralNetworkLayer::_internal_mutable_greaterequal() {
  if (!_internal_has_greaterequal()) {
    clear_layer();
    set_has_greaterequal();
    layer_.greaterequal_ = CreateMaybeMessage< ::CoreML::Specification::GreaterEqualLayerParams >(GetArenaForAllocation());
  }
  return layer_.greaterequal_;
}